

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

void __thiscall Messages::Person::InternalSwap(Person *this,Person *other)

{
  uint32 uVar1;
  int32 iVar2;
  ulong uVar3;
  string *psVar4;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *arena_00;
  
  uVar3 = *(ulong *)&other->field_0x8;
  if ((this->field_0x8 & 1) == 0) {
    if ((uVar3 & 1) == 0) goto LAB_00109a6d;
LAB_00109a5d:
    other_00 = (UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8);
  }
  else {
    if ((uVar3 & 1) != 0) goto LAB_00109a5d;
    other_00 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         ((InternalMetadata *)&other->field_0x8);
  }
  google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8,other_00);
LAB_00109a6d:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->phones_).super_RepeatedPtrFieldBase,
             &(other->phones_).super_RepeatedPtrFieldBase);
  arena = *(Arena **)&this->field_0x8;
  uVar3 = (ulong)arena & 1;
  arena_00 = arena;
  if (uVar3 != 0) {
    arena_00 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->name_).ptr_ !=
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->name_).ptr_ !=
      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar4 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (&this->name_,
                        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
                        ,arena_00);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (&other->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,arena_00
              );
    std::__cxx11::string::swap((string *)psVar4);
    arena = *(Arena **)&this->field_0x8;
    uVar3 = (ulong)((uint)arena & 1);
  }
  if (uVar3 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->email_).ptr_ !=
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->email_).ptr_ !=
      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar4 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (&this->email_,
                        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
                        ,arena);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (&other->email_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,arena);
    std::__cxx11::string::swap((string *)psVar4);
  }
  iVar2 = this->id_;
  this->id_ = other->id_;
  other->id_ = iVar2;
  return;
}

Assistant:

void Person::InternalSwap(Person* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  phones_.InternalSwap(&other->phones_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  email_.Swap(&other->email_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(id_, other->id_);
}